

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::ReservoirQuantileFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_a9;
  LogicalType local_a8 [3];
  vector<duckdb::LogicalType,_true> local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType(local_a8,DECIMAL);
  LogicalType::LogicalType(local_a8 + 1,DOUBLE);
  __l._M_len = 2;
  __l._M_array = local_a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60,__l,
             (allocator_type *)&local_48);
  LogicalType::LogicalType(local_a8 + 2,DECIMAL);
  GetReservoirQuantileDecimalFunction(in_RDI,&local_60,local_a8 + 2);
  LogicalType::~LogicalType(local_a8 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_a8,DECIMAL);
  LogicalType::LogicalType(local_a8 + 2,DOUBLE);
  LogicalType::LIST(local_a8 + 1,local_a8 + 2);
  __l_00._M_len = 2;
  __l_00._M_array = local_a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60,__l_00,
             &local_a9);
  LogicalType::LogicalType(&local_30,DECIMAL);
  LogicalType::LIST(&local_48,&local_30);
  GetReservoirQuantileDecimalFunction(in_RDI,&local_60,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::~LogicalType(&local_30);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_60);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(local_a8 + 2);
  LogicalType::LogicalType(local_a8,TINYINT);
  DefineReservoirQuantile(in_RDI,local_a8);
  LogicalType::~LogicalType(local_a8);
  LogicalType::LogicalType(local_a8,SMALLINT);
  DefineReservoirQuantile(in_RDI,local_a8);
  LogicalType::~LogicalType(local_a8);
  LogicalType::LogicalType(local_a8,INTEGER);
  DefineReservoirQuantile(in_RDI,local_a8);
  LogicalType::~LogicalType(local_a8);
  LogicalType::LogicalType(local_a8,BIGINT);
  DefineReservoirQuantile(in_RDI,local_a8);
  LogicalType::~LogicalType(local_a8);
  LogicalType::LogicalType(local_a8,HUGEINT);
  DefineReservoirQuantile(in_RDI,local_a8);
  LogicalType::~LogicalType(local_a8);
  LogicalType::LogicalType(local_a8,FLOAT);
  DefineReservoirQuantile(in_RDI,local_a8);
  LogicalType::~LogicalType(local_a8);
  LogicalType::LogicalType(local_a8,DOUBLE);
  DefineReservoirQuantile(in_RDI,local_a8);
  LogicalType::~LogicalType(local_a8);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ReservoirQuantileFun::GetFunctions() {
	AggregateFunctionSet reservoir_quantile;

	// DECIMAL
	GetReservoirQuantileDecimalFunction(reservoir_quantile, {LogicalTypeId::DECIMAL, LogicalType::DOUBLE},
	                                    LogicalTypeId::DECIMAL);
	GetReservoirQuantileDecimalFunction(reservoir_quantile,
	                                    {LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::DOUBLE)},
	                                    LogicalType::LIST(LogicalTypeId::DECIMAL));

	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::TINYINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::SMALLINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::INTEGER);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::BIGINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::HUGEINT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::FLOAT);
	DefineReservoirQuantile(reservoir_quantile, LogicalTypeId::DOUBLE);
	return reservoir_quantile;
}